

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproperty.cpp
# Opt level: O0

void __thiscall QPropertyBindingPrivate::clearDependencyObservers(QPropertyBindingPrivate *this)

{
  array<QPropertyObserver,_4UL> *paVar1;
  bool bVar2;
  unsigned_long *puVar3;
  array<QPropertyObserver,_4UL> *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  QPropertyObserverPointer p;
  ulong __n;
  ulong local_28;
  size_type local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  while( true ) {
    paVar1 = in_RDI + 1;
    __n = local_28;
    local_10 = std::array<QPropertyObserver,_4UL>::size
                         ((array<QPropertyObserver,_4UL> *)(in_RDI->_M_elems + 1));
    puVar3 = qMin<unsigned_long>((unsigned_long *)
                                 &paVar1->_M_elems[3].super_QPropertyObserverBase.field_2,&local_10)
    ;
    if (*puVar3 <= __n) break;
    std::array<QPropertyObserver,_4UL>::operator[](in_RDI,__n);
    QPropertyObserverPointer::unlink_fast((QPropertyObserverPointer *)0x412b03);
    local_28 = local_28 + 1;
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
                      *)0x412b27);
  if (bVar2) {
    std::
    unique_ptr<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
    ::operator->((unique_ptr<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>,_std::default_delete<std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>_>_>
                  *)0x412b3e);
    std::vector<QPropertyObserver,_std::allocator<QPropertyObserver>_>::clear
              ((vector<QPropertyObserver,_std::allocator<QPropertyObserver>_> *)0x412b46);
  }
  in_RDI[1]._M_elems[3].super_QPropertyObserverBase.field_2.binding = (QPropertyBindingPrivate *)0x0
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPropertyBindingPrivate::clearDependencyObservers() {
    for (size_t i = 0; i < qMin(dependencyObserverCount, inlineDependencyObservers.size()); ++i) {
        QPropertyObserverPointer p{&inlineDependencyObservers[i]};
        p.unlink_fast();
    }
    if (heapObservers)
        heapObservers->clear();
    dependencyObserverCount = 0;
}